

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

string_t __thiscall
duckdb::StringVector::AddString(StringVector *this,Vector *vector,char *data,idx_t len)

{
  uint uVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t data_00;
  undefined4 uStack_14;
  undefined8 uStack_10;
  
  uVar1 = (uint)data;
  if (uVar1 < 0xd) {
    uStack_10._4_4_ = 0;
    uStack_14 = 0;
    uStack_10._0_4_ = 0;
    uStack_10 = (Vector *)0x0;
    if (uVar1 != 0) {
      switchD_00b1522a::default(&uStack_14,vector,(ulong)(uVar1 & 0xf));
      uStack_10 = (Vector *)CONCAT44(uStack_10._4_4_,(undefined4)uStack_10);
    }
  }
  else {
    uStack_14 = *(undefined4 *)vector;
    uStack_10 = vector;
  }
  data_00.value.pointer.ptr = (char *)len;
  data_00.value._0_8_ = uStack_10;
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       AddString(this,(Vector *)CONCAT44(uStack_14,uVar1),data_00);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

string_t StringVector::AddString(Vector &vector, const char *data, idx_t len) {
	return StringVector::AddString(vector, string_t(data, UnsafeNumericCast<uint32_t>(len)));
}